

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O3

Matrix __thiscall maths::Matrix::inverse(Matrix *this)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  double **ppdVar4;
  double *pdVar5;
  double *pdVar6;
  double **extraout_RDX;
  Matrix *in_RSI;
  long lVar7;
  ulong uVar8;
  Matrix MVar9;
  Matrix IAInverse;
  Matrix U;
  Matrix AI;
  Matrix I;
  Matrix local_70;
  Matrix local_60;
  Matrix local_50;
  Matrix local_40;
  Matrix local_30;
  Matrix local_20;
  
  createIdentity(&local_20,in_RSI->rows_);
  Matrix(&local_40,in_RSI);
  Matrix(&local_50,&local_20);
  augment(&local_30,&local_40,&local_50);
  ~Matrix(&local_50);
  ~Matrix(&local_40);
  gaussianEliminate(&local_60);
  rowReduceFromGaussian(&local_70);
  Matrix(this,in_RSI->rows_,in_RSI->cols_);
  iVar1 = this->rows_;
  if (0 < (long)iVar1) {
    uVar2 = this->cols_;
    iVar3 = in_RSI->cols_;
    ppdVar4 = this->p;
    lVar7 = 0;
    do {
      if (0 < (int)uVar2) {
        pdVar5 = ppdVar4[lVar7];
        pdVar6 = local_70.p[lVar7];
        uVar8 = 0;
        do {
          pdVar5[uVar8] = pdVar6[(long)iVar3 + uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar2 != uVar8);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  ~Matrix(&local_70);
  ~Matrix(&local_60);
  ~Matrix(&local_30);
  ~Matrix(&local_20);
  MVar9.p = extraout_RDX;
  MVar9._0_8_ = this;
  return MVar9;
}

Assistant:

Matrix Matrix::inverse()
{
    Matrix I = Matrix::createIdentity(rows_);
    Matrix AI = Matrix::augment(*this, I);
    Matrix U = AI.gaussianEliminate();
    Matrix IAInverse = U.rowReduceFromGaussian();
    Matrix AInverse(rows_, cols_);
    for (int i = 0; i < AInverse.rows_; ++i) {
        for (int j = 0; j < AInverse.cols_; ++j) {
            AInverse(i, j) = IAInverse(i, j + cols_);
        }
    }
    return AInverse;
}